

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

ImDrawCmd * __thiscall
ImVector<ImDrawCmd>::insert(ImVector<ImDrawCmd> *this,ImDrawCmd *it,ImDrawCmd *v)

{
  long lVar1;
  void *in_RDX;
  ImVector<ImDrawCmd> *in_RSI;
  ImVector<ImDrawCmd> *in_RDI;
  ptrdiff_t off;
  
  lVar1 = ((long)in_RSI - (long)in_RDI->Data) / 0x38;
  if (in_RDI->Size == in_RDI->Capacity) {
    _grow_capacity(in_RDI,in_RDI->Size + 1);
    reserve(in_RSI,(int)((ulong)in_RDX >> 0x20));
  }
  if (lVar1 < in_RDI->Size) {
    memmove(in_RDI->Data + lVar1 + 1,in_RDI->Data + lVar1,(in_RDI->Size - lVar1) * 0x38);
  }
  memcpy(in_RDI->Data + lVar1,in_RDX,0x38);
  in_RDI->Size = in_RDI->Size + 1;
  return in_RDI->Data + lVar1;
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data + Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }